

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayUtility.H
# Opt level: O0

void amrex::printCell<amrex::FArrayBox,void>
               (FabArray<amrex::FArrayBox> *mf,IntVect *cell,int comp,IntVect *ng)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  FArrayBox *pFVar9;
  long lVar10;
  long lVar11;
  Long LVar12;
  ostream *poVar13;
  IntVect *in_RCX;
  int in_EDX;
  IntVect *in_RSI;
  FabArrayBase *in_RDI;
  int i;
  int ncomp;
  ostringstream ss;
  Box result;
  Box *bx;
  MFIter mfi;
  Long result_1;
  Long result_2;
  Long result_3;
  Print *in_stack_fffffffffffff798;
  Print *in_stack_fffffffffffff7a0;
  Print *in_stack_fffffffffffff7b0;
  undefined8 in_stack_fffffffffffff7c0;
  FabArrayBase *in_stack_fffffffffffff7c8;
  MFIter *in_stack_fffffffffffff7d0;
  Box *pBVar14;
  string local_740 [424];
  int local_598;
  int local_594;
  long local_590 [98];
  undefined1 local_280 [28];
  Box local_264;
  Box *local_248;
  MFIter local_240;
  IntVect *local_1e0;
  int local_1d4;
  IntVect *local_1d0;
  FabArrayBase *local_1c8;
  IntVect *local_1c0;
  undefined1 *local_1b8;
  int local_1ac;
  IntVect *local_1a8;
  FArrayBox *local_1a0;
  int local_194;
  IntVect *local_190;
  FArrayBox *local_188;
  int local_17c;
  IntVect *local_178;
  FArrayBox *local_170;
  long local_168;
  IntVect *local_160;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  undefined4 local_13c;
  IntVect *local_138;
  undefined4 local_12c;
  Box *local_128;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  Box *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  long local_f0;
  IntVect *local_e8;
  Box *local_e0;
  undefined4 local_d4;
  Box *local_d0;
  undefined4 local_c4;
  IntVect *local_c0;
  undefined4 local_b4;
  Box *local_b0;
  undefined4 local_a4;
  IntVect *local_a0;
  undefined4 local_94;
  Box *local_90;
  undefined4 local_84;
  IntVect *local_80;
  long local_78;
  IntVect *local_70;
  Box *local_68;
  undefined4 local_5c;
  Box *local_58;
  undefined4 local_4c;
  IntVect *local_48;
  undefined4 local_3c;
  Box *local_38;
  undefined4 local_2c;
  IntVect *local_28;
  undefined4 local_1c;
  Box *local_18;
  undefined4 local_c;
  IntVect *local_8;
  
  local_1e0 = in_RCX;
  local_1d4 = in_EDX;
  local_1d0 = in_RSI;
  local_1c8 = in_RDI;
  MFIter::MFIter(in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8,
                 (uchar)((ulong)in_stack_fffffffffffff7c0 >> 0x38));
  while (bVar6 = MFIter::isValid(&local_240), bVar6) {
    MFIter::validbox((MFIter *)in_stack_fffffffffffff7b0);
    local_1b8 = local_280;
    local_1c0 = local_1e0;
    Box::grow(&local_264,local_1e0);
    local_248 = &local_264;
    bVar6 = Box::contains(local_248,local_1d0);
    if (bVar6) {
      if (local_1d4 < 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_590);
        std::ios_base::precision
                  ((ios_base *)((long)local_590 + *(long *)(local_590[0] + -0x18)),0x11);
        local_594 = FabArrayBase::nComp(local_1c8);
        for (local_598 = 0; local_598 < local_594 + -1; local_598 = local_598 + 1) {
          pFVar9 = FabArray<amrex::FArrayBox>::operator[]
                             ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff7a0,
                              (MFIter *)in_stack_fffffffffffff798);
          local_190 = local_1d0;
          local_194 = local_598;
          pdVar5 = (pFVar9->super_BaseFab<double>).dptr;
          pBVar14 = &(pFVar9->super_BaseFab<double>).domain;
          local_e8 = local_1d0;
          local_80 = local_1d0;
          local_84 = 0;
          local_94 = 0;
          local_f0 = (long)(local_1d0->vect[0] - (pBVar14->smallend).vect[0]);
          local_188 = pFVar9;
          local_e0 = pBVar14;
          local_90 = pBVar14;
          iVar7 = Box::length(pBVar14,0);
          local_a0 = local_e8;
          local_a4 = 1;
          iVar1 = local_e8->vect[1];
          local_b4 = 1;
          iVar2 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[1];
          local_c0 = local_e8;
          local_c4 = 2;
          iVar3 = local_e8->vect[2];
          local_d4 = 2;
          iVar4 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[2];
          local_d0 = pBVar14;
          local_b0 = pBVar14;
          iVar8 = Box::length(pBVar14,1);
          lVar10 = local_f0 + iVar7 * ((iVar1 - iVar2) + (iVar3 - iVar4) * iVar8);
          lVar11 = (long)local_194;
          local_f0 = lVar10;
          LVar12 = Box::numPts((Box *)in_stack_fffffffffffff7b0);
          poVar13 = (ostream *)std::ostream::operator<<(local_590,pdVar5[lVar10 + lVar11 * LVar12]);
          std::operator<<(poVar13,", ");
        }
        local_1a0 = FabArray<amrex::FArrayBox>::operator[]
                              ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff7a0,
                               (MFIter *)in_stack_fffffffffffff798);
        local_1ac = local_594 + -1;
        local_1a8 = local_1d0;
        pdVar5 = (local_1a0->super_BaseFab<double>).dptr;
        pBVar14 = &(local_1a0->super_BaseFab<double>).domain;
        local_70 = local_1d0;
        local_8 = local_1d0;
        local_c = 0;
        local_1c = 0;
        local_78 = (long)(local_1d0->vect[0] - (pBVar14->smallend).vect[0]);
        local_68 = pBVar14;
        local_18 = pBVar14;
        iVar7 = Box::length(pBVar14,0);
        local_28 = local_70;
        local_2c = 1;
        iVar1 = local_70->vect[1];
        local_3c = 1;
        iVar2 = (pBVar14->smallend).vect[1];
        local_48 = local_70;
        local_4c = 2;
        iVar3 = local_70->vect[2];
        local_5c = 2;
        iVar4 = (pBVar14->smallend).vect[2];
        local_58 = pBVar14;
        local_38 = pBVar14;
        iVar8 = Box::length(pBVar14,1);
        lVar10 = local_78 + iVar7 * ((iVar1 - iVar2) + (iVar3 - iVar4) * iVar8);
        lVar11 = (long)local_1ac;
        local_78 = lVar10;
        LVar12 = Box::numPts((Box *)in_stack_fffffffffffff7b0);
        std::ostream::operator<<(local_590,pdVar5[lVar10 + lVar11 * LVar12]);
        OutStream();
        AllPrint::AllPrint((AllPrint *)in_stack_fffffffffffff7a0,
                           (ostream *)in_stack_fffffffffffff798);
        Print::operator<<(in_stack_fffffffffffff7a0,(char (*) [10])in_stack_fffffffffffff798);
        Print::operator<<(in_stack_fffffffffffff7a0,(IntVect *)in_stack_fffffffffffff798);
        in_stack_fffffffffffff7b0 =
             Print::operator<<(in_stack_fffffffffffff7a0,(char (*) [9])in_stack_fffffffffffff798);
        Print::operator<<(in_stack_fffffffffffff7a0,(Box *)in_stack_fffffffffffff798);
        in_stack_fffffffffffff7a0 =
             Print::operator<<(in_stack_fffffffffffff7a0,(char (*) [3])in_stack_fffffffffffff798);
        std::__cxx11::ostringstream::str();
        in_stack_fffffffffffff798 =
             Print::operator<<(in_stack_fffffffffffff7a0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff798);
        Print::operator<<(in_stack_fffffffffffff7a0,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)in_stack_fffffffffffff798);
        std::__cxx11::string::~string(local_740);
        AllPrint::~AllPrint((AllPrint *)0x12e0129);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_590);
      }
      else {
        OutStream();
        AllPrint::AllPrint((AllPrint *)in_stack_fffffffffffff7a0,
                           (ostream *)in_stack_fffffffffffff798);
        Print::SetPrecision(in_stack_fffffffffffff7a0,
                            (int)((ulong)in_stack_fffffffffffff798 >> 0x20));
        Print::operator<<(in_stack_fffffffffffff7a0,(char (*) [10])in_stack_fffffffffffff798);
        Print::operator<<(in_stack_fffffffffffff7a0,(IntVect *)in_stack_fffffffffffff798);
        Print::operator<<(in_stack_fffffffffffff7a0,(char (*) [9])in_stack_fffffffffffff798);
        Print::operator<<(in_stack_fffffffffffff7a0,(Box *)in_stack_fffffffffffff798);
        Print::operator<<(in_stack_fffffffffffff7a0,(char (*) [3])in_stack_fffffffffffff798);
        pFVar9 = FabArray<amrex::FArrayBox>::operator[]
                           ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffff7a0,
                            (MFIter *)in_stack_fffffffffffff798);
        local_178 = local_1d0;
        local_17c = local_1d4;
        pBVar14 = &(pFVar9->super_BaseFab<double>).domain;
        local_160 = local_1d0;
        local_f8 = local_1d0;
        local_fc = 0;
        local_10c = 0;
        local_168 = (long)(local_1d0->vect[0] - (pBVar14->smallend).vect[0]);
        local_170 = pFVar9;
        local_158 = pBVar14;
        local_108 = pBVar14;
        iVar7 = Box::length(pBVar14,0);
        local_118 = local_160;
        local_11c = 1;
        iVar1 = local_160->vect[1];
        local_12c = 1;
        iVar2 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[1];
        local_138 = local_160;
        local_13c = 2;
        iVar3 = local_160->vect[2];
        local_14c = 2;
        iVar4 = (pFVar9->super_BaseFab<double>).domain.smallend.vect[2];
        local_148 = pBVar14;
        local_128 = pBVar14;
        iVar8 = Box::length(pBVar14,1);
        local_168 = local_168 + iVar7 * ((iVar1 - iVar2) + (iVar3 - iVar4) * iVar8);
        Box::numPts((Box *)in_stack_fffffffffffff7b0);
        Print::operator<<(in_stack_fffffffffffff7a0,(double *)in_stack_fffffffffffff798);
        Print::operator<<(in_stack_fffffffffffff7a0,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)in_stack_fffffffffffff798);
        AllPrint::~AllPrint((AllPrint *)0x12dfac7);
      }
    }
    MFIter::operator++(&local_240);
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffff7a0);
  return;
}

Assistant:

void
printCell (FabArray<FAB> const& mf, const IntVect& cell, int comp = -1,
           const IntVect& ng = IntVect::TheZeroVector())
{
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        const Box& bx = amrex::grow(mfi.validbox(), ng);
        if (bx.contains(cell)) {
            if (comp >= 0) {
                amrex::AllPrint().SetPrecision(17) << " At cell " << cell << " in Box " << bx
                                                   << ": " << mf[mfi](cell, comp) << std::endl;
            } else {
                std::ostringstream ss;
                ss.precision(17);
                const int ncomp = mf.nComp();
                for (int i = 0; i < ncomp-1; ++i)
                {
                    ss << mf[mfi](cell,i) << ", ";
                }
                ss << mf[mfi](cell,ncomp-1);
                amrex::AllPrint() << " At cell " << cell << " in Box " << bx
                                  << ": " << ss.str() << std::endl;
            }
        }
    }
}